

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O1

void __thiscall btRaycastVehicle::resetSuspension(btRaycastVehicle *this)

{
  btWheelInfo *pbVar1;
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  btScalar bVar5;
  
  if (0 < (this->m_wheelInfo).m_size) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pbVar1 = (this->m_wheelInfo).m_data;
      bVar5 = btWheelInfo::getSuspensionRestLength
                        ((btWheelInfo *)
                         ((long)(pbVar1->m_raycastInfo).m_contactNormalWS.m_floats + lVar3));
      *(btScalar *)((long)(pbVar1->m_raycastInfo).m_hardPointWS.m_floats + lVar3 + -4) = bVar5;
      auVar2._8_4_ = *(uint *)((long)(pbVar1->m_raycastInfo).m_wheelDirectionWS.m_floats + lVar3 + 8
                              ) ^ 0x80000000;
      auVar2._0_8_ = *(ulong *)((long)(pbVar1->m_raycastInfo).m_wheelDirectionWS.m_floats + lVar3) ^
                     0x8000000080000000;
      auVar2._12_4_ = 0;
      *(undefined1 (*) [16])((long)(pbVar1->m_raycastInfo).m_contactNormalWS.m_floats + lVar3) =
           auVar2;
      *(undefined8 *)((long)(&pbVar1->m_wheelAxleCS + 5) + lVar3 + 8) = 0x3f800000;
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x128;
    } while (lVar4 < (this->m_wheelInfo).m_size);
  }
  return;
}

Assistant:

void btRaycastVehicle::resetSuspension()
{

	int i;
	for (i=0;i<m_wheelInfo.size();	i++)
	{
			btWheelInfo& wheel = m_wheelInfo[i];
			wheel.m_raycastInfo.m_suspensionLength = wheel.getSuspensionRestLength();
			wheel.m_suspensionRelativeVelocity = btScalar(0.0);
			
			wheel.m_raycastInfo.m_contactNormalWS = - wheel.m_raycastInfo.m_wheelDirectionWS;
			//wheel_info.setContactFriction(btScalar(0.0));
			wheel.m_clippedInvContactDotSuspension = btScalar(1.0);
	}
}